

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIButton.cpp
# Opt level: O3

void __thiscall
irr::gui::CGUIButton::setImage
          (CGUIButton *this,EGUI_BUTTON_IMAGE_STATE state,ITexture *image,rect<int> *sourceRect)

{
  code *pcVar1;
  ITexture *pIVar2;
  _func_int *p_Var3;
  vector2d<int> vVar4;
  
  if ((int)state < 9) {
    if (image != (ITexture *)0x0) {
      *(int *)(image->_vptr_ITexture[-3] + 8 + (long)&(image->NamedPath).Path) =
           *(int *)(image->_vptr_ITexture[-3] + 8 + (long)&(image->NamedPath).Path) + 1;
    }
    pIVar2 = this->ButtonImages[state].Texture;
    if (pIVar2 != (ITexture *)0x0) {
      p_Var3 = pIVar2->_vptr_ITexture[-3];
      pcVar1 = p_Var3 + 8 + (long)&(pIVar2->NamedPath).Path;
      *(int *)pcVar1 = *(int *)pcVar1 + -1;
      if (*(int *)pcVar1 == 0) {
        (**(code **)(*(long *)((long)&pIVar2->_vptr_ITexture + (long)p_Var3) + 8))();
      }
    }
    this->ButtonImages[state].Texture = image;
    vVar4 = sourceRect->LowerRightCorner;
    this->ButtonImages[state].SourceRect.UpperLeftCorner = sourceRect->UpperLeftCorner;
    this->ButtonImages[state].SourceRect.LowerRightCorner = vVar4;
  }
  return;
}

Assistant:

void CGUIButton::setImage(EGUI_BUTTON_IMAGE_STATE state, video::ITexture *image, const core::rect<s32> &sourceRect)
{
	if (state >= EGBIS_COUNT)
		return;

	if (image)
		image->grab();

	u32 stateIdx = (u32)state;
	if (ButtonImages[stateIdx].Texture)
		ButtonImages[stateIdx].Texture->drop();

	ButtonImages[stateIdx].Texture = image;
	ButtonImages[stateIdx].SourceRect = sourceRect;
}